

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_fixed16.c
# Opt level: O1

rt_function_error_t exec_affine_fixed16(rt_function_t *f)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  void *__s;
  long lVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  short sVar14;
  ulong uVar15;
  long lVar16;
  int bpos;
  long lVar17;
  short *psVar18;
  short sVar19;
  short *psVar20;
  long lVar21;
  short *psVar22;
  ulong local_68;
  long local_60;
  
  plVar7 = *f->local_context;
  if (plVar7[6] == 0) {
    psVar22 = (short *)0x0;
  }
  else {
    psVar22 = *(short **)(plVar7[6] + 0x18);
  }
  bVar1 = *(byte *)(*plVar7 + 0x10);
  bVar2 = *(byte *)(plVar7[2] + 0x10);
  bVar11 = *(byte *)(plVar7[8] + 0x10) >> 4;
  lVar21 = *(long *)(*plVar7 + 0x18);
  lVar8 = *(long *)(plVar7[2] + 0x18);
  __s = *(void **)(plVar7[8] + 0x18);
  lVar9 = plVar7[4];
  if (lVar9 != 0) {
    bVar12 = *(byte *)(lVar9 + 0x10) >> 4;
    if (bVar11 < bVar12) {
      uVar5 = *(uint *)(plVar7 + 0xd);
      if ((ulong)uVar5 != 0) {
        lVar9 = *(long *)(lVar9 + 0x18);
        uVar15 = 0;
        do {
          *(short *)(lVar9 + uVar15 * 2) =
               (short)((int)*(short *)(lVar9 + uVar15 * 2) / (1 << (bVar12 - bVar11 & 0x1f)));
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
    }
    else if (bVar12 < bVar11) {
      puts(
          "OUTPUT variable has less range bits than BIAS variable. Please make sure affine/b has same or less range bits than Output to avoid overflow."
          );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(__s,0,(long)(int)plVar7[9] * 2);
  lVar9 = plVar7[0xc];
  if (0 < (long)(int)lVar9) {
    uVar5 = *(uint *)(plVar7 + 0xd);
    iVar6 = *(int *)((long)plVar7 + 100);
    lVar10 = plVar7[4];
    local_68 = 0;
    local_60 = 0;
    do {
      if (0 < (int)uVar5) {
        psVar18 = (short *)((long)__s + local_60 * (int)uVar5 * 2);
        uVar15 = 0;
        lVar17 = lVar8;
        psVar20 = psVar22;
        do {
          if (iVar6 < 1) {
            lVar13 = 0;
          }
          else {
            lVar16 = 0;
            lVar13 = 0;
            do {
              lVar13 = lVar13 + (long)*(short *)(lVar17 + lVar16 * 2) *
                                (long)*(short *)(lVar21 + lVar16 * 2);
              lVar16 = lVar16 + 1;
            } while (iVar6 != (int)lVar16);
          }
          lVar13 = lVar13 / (long)(ulong)(uint)(1 << (((bVar2 >> 4) + (bVar1 >> 4)) - bVar11 & 0x1f)
                                               );
          sVar14 = (short)lVar13;
          if (lVar13 < -0x7fff) {
            sVar14 = -0x8000;
          }
          if (0x7ffe < lVar13) {
            sVar14 = 0x7fff;
          }
          *psVar18 = sVar14;
          if (psVar22 != (short *)0x0) {
            sVar19 = *psVar20;
            psVar20 = psVar20 + 1;
            *psVar18 = (short)(((int)sVar19 * (int)sVar14) /
                              (1 << (*(byte *)(plVar7[6] + 0x10) >> 4)));
          }
          psVar18 = psVar18 + 1;
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + (long)iVar6 * 2;
        } while (uVar15 != uVar5);
      }
      if ((lVar10 != 0) && (0 < (int)uVar5)) {
        lVar17 = *(long *)(lVar10 + 0x18);
        uVar15 = 0;
        do {
          uVar3 = *(ushort *)(lVar17 + uVar15 * 2);
          uVar4 = *(ushort *)((long)__s + uVar15 * 2 + local_68 * 2);
          sVar14 = uVar4 + uVar3;
          if ((((short)uVar3 < 1) || ((short)uVar4 < 1)) || (sVar19 = 0x7fff, -1 < sVar14)) {
            sVar19 = sVar14;
            if (0 < sVar14) {
              sVar19 = -0x8000;
            }
            if (-1 < (short)(uVar4 & uVar3)) {
              sVar19 = sVar14;
            }
          }
          *(short *)((long)__s + uVar15 * 2 + local_68 * 2) = sVar19;
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      local_60 = local_60 + 1;
      lVar21 = lVar21 + (long)iVar6 * 2;
      local_68 = (ulong)((int)local_68 + uVar5);
    } while (local_60 != (int)lVar9);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_fixed16(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  int16_t *input = (int16_t *)(p->input->data);
  int16_t *weight = (int16_t *)(p->weight->data);
  int16_t *output = (int16_t *)(p->output->data);
  int16_t *alpha = 0;

  const unsigned nbits_rescale =
      p->input->fp_pos + p->weight->fp_pos - p->output->fp_pos;

  if (p->alpha) {
    alpha = (int16_t *)p->alpha->data;
  }

  // If bias has less range bits (=more precision bits) than output, rescale
  // bias.
  // Otherwise, output has too few range bits. Change format before starting
  // computations.
  if (p->bias) {
    const unsigned int b_fp = p->bias->fp_pos;
    const unsigned int out_fp = p->output->fp_pos;
    const unsigned bias_size = p->output_loop_size;
    int16_t *bias = (int16_t *)(p->bias->data);

    if (b_fp > out_fp) {
      int i;
      for (i = 0; i < bias_size; i++) {
        *(bias + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure affine/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  // Clear output
  memset(output, 0, sizeof(int16_t) * p->output_size);

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;
    int16_t *o_addr = output + output_offset;
    int16_t *alpha_addr = alpha;

    for (j = 0; j < p->output_loop_size; ++j) {
      int weight_offset = j * p->input_loop_size;

      int16_t *i_addr = input + input_offset;
      int16_t *w_addr = weight + weight_offset;
      int64_t sum = 0;

      for (i = 0; i < p->input_loop_size; ++i) {
        sum += (*i_addr++) * (*w_addr++);
      }
      // Rescale output to desired # of precision bits
      *o_addr = saturate64_to_16(sum / (1 << nbits_rescale));

      if (alpha) {
        *o_addr = (((int32_t)(*o_addr) * (int32_t)(*alpha_addr++))) /
                  (1 << p->alpha->fp_pos);
      }
      ++o_addr;
    }

    // Bias
    if (p->bias) {
      int16_t *bias = (int16_t *)(p->bias->data);
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        sum_acc_sat16(output + opos, *(bias + bpos));
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}